

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntSelectSortCost2Reverse(int *pArray,int nSize,int *pCosts)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (1 < nSize) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar7 = uVar5 & 0xffffffff;
      uVar6 = uVar4;
      do {
        uVar3 = (uint)uVar6;
        if (pCosts[uVar6] <= pCosts[(int)(uint)uVar7]) {
          uVar3 = (uint)uVar7;
        }
        uVar6 = uVar6 + 1;
        uVar7 = (ulong)uVar3;
      } while ((uint)nSize != uVar6);
      iVar2 = pArray[uVar5];
      pArray[uVar5] = pArray[(int)uVar3];
      pArray[(int)uVar3] = iVar2;
      iVar2 = pCosts[uVar5];
      pCosts[uVar5] = pCosts[(int)uVar3];
      pCosts[(int)uVar3] = iVar2;
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != nSize - 1);
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSortCost2Reverse( int * pArray, int nSize, int * pCosts )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( pCosts[j] > pCosts[best_i] )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
        ABC_SWAP( int, pCosts[i], pCosts[best_i] );
    }
}